

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
::AssertHashEqConsistent<void_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
           *this,void **key)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  slot_type pvVar3;
  uint uVar4;
  long lVar5;
  uintptr_t v;
  slot_type *ppvVar6;
  undefined1 (*pauVar7) [16];
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
              *)this);
  if (1 < *(ulong *)(this + 8)) {
    uVar11 = ((ulong)*key ^ 0x1917468) * -0x234dd359734ecb13;
    uVar12 = (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
              (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
              (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38) ^ (ulong)*key;
    uVar11 = *(ulong *)this;
    if (uVar11 == 1) {
      ppvVar6 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                            *)this);
      pvVar3 = *ppvVar6;
      if ((pvVar3 == *key) &&
         (uVar11 = ((ulong)pvVar3 ^ 0x1917468) * -0x234dd359734ecb13,
         uVar12 != ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                     (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                     (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                     (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pvVar3))) {
LAB_00606e36:
        __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfbf,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const void *>, absl::container_internal::HashEq<const void *>::Hash, absl::container_internal::HashEq<const void *>::Eq, std::allocator<const void *>>::AssertHashEqConsistent(const void *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const void *>, Hash = absl::container_internal::HashEq<const void *>::Hash, Eq = absl::container_internal::HashEq<const void *>::Eq, Alloc = std::allocator<const void *>]"
                     );
      }
    }
    else {
      if (uVar11 == 0) {
        __assert_fail("cap >= kDefaultCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb75,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const void *>, absl::container_internal::HashEq<const void *>::Hash, absl::container_internal::HashEq<const void *>::Eq, std::allocator<const void *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const void *>, Hash = absl::container_internal::HashEq<const void *>::Hash, Eq = absl::container_internal::HashEq<const void *>::Eq, Alloc = std::allocator<const void *>]"
                     );
      }
      if (uVar11 < 0x11) {
        ppvVar6 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                  ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                                *)this);
        uVar11 = *(ulong *)this;
        pauVar7 = *(undefined1 (**) [16])(this + 0x10);
        if (uVar11 < 0xf) {
          if (8 < uVar11) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const void *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar11 = *(ulong *)(*pauVar7 + uVar11) & 0x8080808080808080;
          if (uVar11 != 0x8080808080808080) {
            uVar11 = uVar11 ^ 0x8080808080808080;
            pvVar2 = *key;
            uVar8 = ((ulong)pvVar2 ^ 0x1917468) * -0x234dd359734ecb13;
            do {
              lVar5 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              if ((*(void **)((long)ppvVar6 + ((ulong)((uint)lVar5 & 0xfffffff8) - 8)) == pvVar2) &&
                 (uVar12 != ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                              (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                              (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                              (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)pvVar2)))
              goto LAB_00606e36;
              uVar11 = uVar11 & uVar11 - 1;
            } while (uVar11 != 0);
          }
        }
        else if (1 < *(ulong *)(this + 8)) {
          uVar11 = *(ulong *)(this + 8) >> 1;
          pvVar3 = *key;
          uVar8 = ((ulong)pvVar3 ^ 0x1917468) * -0x234dd359734ecb13;
          do {
            auVar1 = *pauVar7;
            uVar9 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
            if (uVar9 != 0xffff) {
              uVar9 = ~uVar9;
              do {
                uVar4 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                if ((char)(*pauVar7)[uVar4] < '\0') {
                  __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x79d,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const void *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                               );
                }
                if ((ppvVar6[uVar4] == pvVar3) &&
                   (uVar12 != ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                                (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)pvVar3)))
                goto LAB_00606e36;
                uVar11 = uVar11 - 1;
                uVar10 = (ushort)(uVar9 - 1) & (ushort)uVar9;
                uVar9 = CONCAT22((short)(uVar9 - 1 >> 0x10),uVar10);
              } while (uVar10 != 0);
              if (uVar11 == 0) {
                return;
              }
            }
            pauVar7 = pauVar7 + 1;
            ppvVar6 = ppvVar6 + 0x10;
            if (auVar1[0xf] == 0xff) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const void *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          } while( true );
        }
      }
    }
  }
  return;
}

Assistant:

void AssertHashEqConsistent(const K& key) {
#ifdef NDEBUG
    return;
#endif
    // If the hash/eq functors are known to be consistent, then skip validation.
    if (std::is_same<hasher, absl::container_internal::StringHash>::value &&
        std::is_same<key_equal, absl::container_internal::StringEq>::value) {
      return;
    }
    if (std::is_scalar<key_type>::value &&
        std::is_same<hasher, absl::Hash<key_type>>::value &&
        std::is_same<key_equal, std::equal_to<key_type>>::value) {
      return;
    }
    if (empty()) return;

    const size_t hash_of_arg = hash_ref()(key);
    const auto assert_consistent = [&](const ctrl_t*, slot_type* slot) {
      const value_type& element = PolicyTraits::element(slot);
      const bool is_key_equal =
          PolicyTraits::apply(EqualElement<K>{key, eq_ref()}, element);
      if (!is_key_equal) return;

      const size_t hash_of_slot =
          PolicyTraits::apply(HashElement{hash_ref()}, element);
      ABSL_ATTRIBUTE_UNUSED const bool is_hash_equal =
          hash_of_arg == hash_of_slot;
      assert((!is_key_equal || is_hash_equal) &&
             "eq(k1, k2) must imply that hash(k1) == hash(k2). "
             "hash/eq functors are inconsistent.");
    };

    if (is_soo()) {
      assert_consistent(/*unused*/ nullptr, soo_slot());
      return;
    }
    // We only do validation for small tables so that it's constant time.
    if (capacity() > 16) return;
    IterateOverFullSlots(common(), slot_array(), assert_consistent);
  }